

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O3

void locgen_load_bitmaps(void)

{
  load_loc_bitmap(&bottomin,"images/scripting/bottomin.xbm");
  load_loc_bitmap(&bottomout,"images/scripting/bottomout.xbm");
  load_loc_bitmap(&centerX,"images/scripting/centerX.xbm");
  load_loc_bitmap(&centerY,"images/scripting/centerY.xbm");
  load_loc_bitmap(&leftin,"images/scripting/leftin.xbm");
  load_loc_bitmap(&leftout,"images/scripting/leftout.xbm");
  load_loc_bitmap(&rightin,"images/scripting/rightin.xbm");
  load_loc_bitmap(&rightout,"images/scripting/rightout.xbm");
  load_loc_bitmap(&topin,"images/scripting/topin.xbm");
  load_loc_bitmap(&topout,"images/scripting/topout.xbm");
  load_loc_bitmap(&heightdiff,"images/scripting/heightdiff.xbm");
  load_loc_bitmap(&heightpercent,"images/scripting/heightpercent.xbm");
  load_loc_bitmap(&widthdiff,"images/scripting/widthdiff.xbm");
  load_loc_bitmap(&widthpercent,"images/scripting/widthpercent.xbm");
  return;
}

Assistant:

void
locgen_load_bitmaps()
{
#if ((defined _WIN32) || (defined _MACINTOSH))
  load_loc_bitmap(bottomin, "images/scripting/bottomin.gif");
  load_loc_bitmap(bottomout, "images/scripting/bottomout.gif");
  load_loc_bitmap(centerX, "images/scripting/centerX.gif");
  load_loc_bitmap(centerY, "images/scripting/centerY.gif");
  load_loc_bitmap(leftin, "images/scripting/leftin.gif");
  load_loc_bitmap(leftout, "images/scripting/leftout.gif");
  load_loc_bitmap(rightin, "images/scripting/rightin.gif");
  load_loc_bitmap(rightout, "images/scripting/rightout.gif");
  load_loc_bitmap(topin, "images/scripting/topin.gif");
  load_loc_bitmap(topout, "images/scripting/topout.gif");
  load_loc_bitmap(heightdiff, "images/scripting/heightdiff.gif");
  load_loc_bitmap(heightpercent, "images/scripting/heightpercent.gif");
  load_loc_bitmap(widthdiff, "images/scripting/widthdiff.gif");
  load_loc_bitmap(widthpercent, "images/scripting/widthpercent.gif");
#else
  load_loc_bitmap(bottomin, "images/scripting/bottomin.xbm");
  load_loc_bitmap(bottomout, "images/scripting/bottomout.xbm");
  load_loc_bitmap(centerX, "images/scripting/centerX.xbm");
  load_loc_bitmap(centerY, "images/scripting/centerY.xbm");
  load_loc_bitmap(leftin, "images/scripting/leftin.xbm");
  load_loc_bitmap(leftout, "images/scripting/leftout.xbm");
  load_loc_bitmap(rightin, "images/scripting/rightin.xbm");
  load_loc_bitmap(rightout, "images/scripting/rightout.xbm");
  load_loc_bitmap(topin, "images/scripting/topin.xbm");
  load_loc_bitmap(topout, "images/scripting/topout.xbm");
  load_loc_bitmap(heightdiff, "images/scripting/heightdiff.xbm");
  load_loc_bitmap(heightpercent, "images/scripting/heightpercent.xbm");
  load_loc_bitmap(widthdiff, "images/scripting/widthdiff.xbm");
  load_loc_bitmap(widthpercent, "images/scripting/widthpercent.xbm");
#endif
}